

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::checkSameOperands(CheckerVisitor *this,BinExpr *expr)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Node *rhs;
  Node *lhs;
  
  if (((this->effectsOnly != false) ||
      (uVar2 = (ulong)(expr->super_Expr).super_Node._op, 0x2a < uVar2)) ||
     ((0x5b9ffe00000U >> (uVar2 & 0x3f) & 1) == 0)) {
    return;
  }
  rhs = &expr->_rhs->super_Node;
  for (lhs = &expr->_lhs->super_Node; lhs != (Node *)0x0;
      lhs = (Node *)(((Node *)&lhs[1].super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj) {
    if (lhs->_op != TO_PAREN) goto LAB_0014fdee;
  }
  lhs = (Node *)0x0;
LAB_0014fdee:
  do {
    if (rhs == (Node *)0x0) {
      rhs = (Node *)0x0;
LAB_0014fe01:
      bVar1 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
      if (!bVar1) {
        return;
      }
      if ((lhs->_op == TO_LITERAL) && (*(int *)&lhs->field_0x1c - 1U < 2)) {
        return;
      }
      pcVar3 = treeopStr((expr->super_Expr).super_Node._op);
      report(this,(Node *)expr,0x47,pcVar3);
      return;
    }
    if (rhs->_op != TO_PAREN) goto LAB_0014fe01;
    rhs = (Node *)rhs[1].super_ArenaObj._vptr_ArenaObj;
  } while( true );
}

Assistant:

void CheckerVisitor::checkSameOperands(const BinExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (isSuspiciousSameOperandsBinaryOp(expr->op())) {
    const Expr *ll = deparen(l);
    const Expr *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      if (ll->op() != TO_LITERAL || (ll->asLiteral()->kind() != LK_FLOAT && ll->asLiteral()->kind() != LK_INT)) { // -V522
        report(expr, DiagnosticsId::DI_SAME_OPERANDS, treeopStr(expr->op()));
      }
    }
  }
}